

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawData::AddDrawList(ImDrawData *this,ImDrawList *draw_list)

{
  ImDrawCmd *pIVar1;
  bool bVar2;
  uint uVar3;
  
  uVar3 = (draw_list->CmdBuffer).Size;
  if (0 < (int)uVar3) {
    pIVar1 = (draw_list->CmdBuffer).Data;
    do {
      if ((pIVar1[(ulong)uVar3 - 1].ElemCount != 0) ||
         (pIVar1[(ulong)uVar3 - 1].UserCallback != (ImDrawCallback)0x0)) break;
      (draw_list->CmdBuffer).Size = uVar3 - 1;
      bVar2 = 1 < (int)uVar3;
      uVar3 = uVar3 - 1;
    } while (bVar2);
  }
  ImGui::AddDrawListToDrawDataEx(this,&this->CmdLists,draw_list);
  return;
}

Assistant:

void ImDrawData::AddDrawList(ImDrawList* draw_list)
{
    IM_ASSERT(CmdLists.Size == CmdListsCount);
    draw_list->_PopUnusedDrawCmd();
    ImGui::AddDrawListToDrawDataEx(this, &CmdLists, draw_list);
}